

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::StructSchema::Field&>
          (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           *this,ArrayPtr<const_kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                 table,Field *params)

{
  SegmentReader *pSVar1;
  uint uVar2;
  uint uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  Entry *pEVar6;
  ulong uVar7;
  CapTableReader *pCVar8;
  long *in_R8;
  uint uVar9;
  ulong uVar10;
  Arena **ppAVar11;
  ArrayPtr<const_unsigned_char> s;
  Maybe<unsigned_long> MVar12;
  uint local_30;
  uint local_2c;
  
  aVar4.value = table.size_;
  pEVar6 = table.ptr;
  aVar5.value = aVar4.value;
  if ((pEVar6->key).proto._reader.capTable != (CapTableReader *)0x0) {
    local_30 = kj::_::HashCoder::operator*
                         ((HashCoder *)&kj::_::HASHCODER,(RawBrandedSchema *)*in_R8);
    uVar2 = *(uint *)(in_R8 + 1) * 0x8000 + ~*(uint *)(in_R8 + 1);
    uVar2 = (uVar2 >> 0xc ^ uVar2) * 5;
    local_2c = (uVar2 >> 4 ^ uVar2) * 0x809;
    local_2c = local_2c >> 0x10 ^ local_2c;
    s.size_ = 8;
    s.ptr = (uchar *)&local_30;
    uVar3 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
    pSVar1 = (pEVar6->key).proto._reader.segment;
    aVar5 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            (pEVar6->key).proto._reader.capTable;
    uVar7 = (ulong)((int)aVar5.value - 1U & uVar3);
    uVar9 = *(uint *)((long)&pSVar1->arena + uVar7 * 8 + 4);
    if (uVar9 != 0) {
      ppAVar11 = &pSVar1->arena + uVar7;
      do {
        if ((((uVar9 != 1) && (*(uint *)ppAVar11 == uVar3)) &&
            (uVar10 = (ulong)(uVar9 - 2),
            ((CapTableReader *)(aVar4.value + uVar10 * 0x48))->_vptr_CapTableReader ==
            (_func_int **)*in_R8)) &&
           (*(int *)&((CapTableReader *)(aVar4.value + 8))[uVar10 * 9]._vptr_CapTableReader ==
            (int)in_R8[1])) {
          *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = uVar10;
          goto LAB_0017a8d9;
        }
        pCVar8 = (CapTableReader *)(uVar7 + 1);
        uVar7 = (ulong)pCVar8 & 0xffffffff;
        if (pCVar8 == (CapTableReader *)aVar5.value) {
          uVar7 = 0;
        }
        ppAVar11 = &pSVar1->arena + uVar7;
        uVar9 = *(uint *)((long)ppAVar11 + 4);
      } while (uVar9 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           )0x0;
LAB_0017a8d9:
  MVar12.ptr.field_1.value = aVar5.value;
  MVar12.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar12.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }